

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

schar acurr(int x)

{
  schar sVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (int)u.acurr.a[x] + (int)u.atemp.a[x] + (int)u.abon.a[x];
  if (x == 5) {
    if (0x11 < (int)uVar3) {
LAB_0014e6bf:
      uVar2 = 3;
      if (3 < (int)uVar3) {
        uVar2 = uVar3;
      }
      sVar1 = '\x19';
      if ((int)uVar2 < 0x19) {
        sVar1 = (schar)uVar2;
      }
      return sVar1;
    }
    sVar1 = '\x12';
    if ((youmonst.data)->mlet != '\x0e') {
      if (1 < u.umonnum - 0x12fU) goto LAB_0014e6bf;
    }
  }
  else if (x == 0) {
    uVar2 = 3;
    if (3 < (int)uVar3) {
      uVar2 = uVar3;
    }
    uVar3 = 0x7d;
    if ((int)uVar2 < 0x7d) {
      uVar3 = uVar2;
    }
    if (((((((uarmu == (obj *)0x0) || (sVar1 = '}', (uarmu->oprops & 0x80) == 0)) &&
           ((uarm == (obj *)0x0 || (sVar1 = '}', (uarm->oprops & 0x80) == 0)))) &&
          (((uarmc == (obj *)0x0 || (sVar1 = '}', (uarmc->oprops & 0x80) == 0)) &&
           ((uarmg == (obj *)0x0 ||
            ((sVar1 = '}', (uarmg->oprops & 0x80) == 0 && (uarmg->otyp != 0x91)))))))) &&
         (((uarms == (obj *)0x0 || (sVar1 = '}', (uarms->oprops & 0x80) == 0)) &&
          ((uarmh == (obj *)0x0 || (sVar1 = '}', (uarmh->oprops & 0x80) == 0)))))) &&
        ((uarmf == (obj *)0x0 || (sVar1 = '}', (uarmf->oprops & 0x80) == 0)))) &&
       ((((uleft == (obj *)0x0 || (sVar1 = '}', (uleft->oprops & 0x80) == 0)) &&
         ((uright == (obj *)0x0 || (sVar1 = '}', (uright->oprops & 0x80) == 0)))) &&
        ((uamul == (obj *)0x0 || (sVar1 = '}', (uamul->oprops & 0x80) == 0)))))) {
      if ((uwep != (obj *)0x0) && (uwep->oartifact == '\x11')) {
        sVar1 = 'v';
        if (0x76 < uVar3) {
          sVar1 = (schar)uVar3;
        }
        return sVar1;
      }
      return (schar)uVar3;
    }
  }
  else if ((uarmh == (obj *)0x0 || 2 < (uint)x) || (sVar1 = '\x06', uarmh->otyp != 0x4d))
  goto LAB_0014e6bf;
  return sVar1;
}

Assistant:

schar acurr(int x)
{
	int tmp = (u.abon.a[x] + u.atemp.a[x] + u.acurr.a[x]);

	if (x == A_STR) {
		tmp = (tmp >= 125) ? 125 : ((tmp <= 3) ? 3 : tmp);
		if ((uarmu && (uarmu->oprops & ITEM_POWER)) ||
		    (uarm && (uarm->oprops & ITEM_POWER)) ||
		    (uarmc && (uarmc->oprops & ITEM_POWER)) ||
		    (uarmg && ((uarmg->oprops & ITEM_POWER) ||
			       uarmg->otyp == GAUNTLETS_OF_POWER)) ||
		    (uarms && (uarms->oprops & ITEM_POWER)) ||
		    (uarmh && (uarmh->oprops & ITEM_POWER)) ||
		    (uarmf && (uarmf->oprops & ITEM_POWER)) ||
		    (uleft && (uleft->oprops & ITEM_POWER)) ||
		    (uright && (uright->oprops & ITEM_POWER)) ||
		    (uamul && (uamul->oprops & ITEM_POWER)))
		    return 125;
		else if (uwep && uwep->oartifact == ART_GIANTSLAYER)
		    return (schar)(tmp < 118 ? 118 : tmp);
		else return (schar)tmp;
	} else if (x == A_CHA) {
		if (tmp < 18 && (youmonst.data->mlet == S_NYMPH ||
		    u.umonnum==PM_SUCCUBUS || u.umonnum == PM_INCUBUS))
		    return 18;
	} else if (x == A_INT || x == A_WIS) {
		/* yes, this may raise int/wis if player is sufficiently
		 * stupid.  there are lower levels of cognition than "dunce".
		 */
		if (uarmh && uarmh->otyp == DUNCE_CAP) return 6;
	}
	return (schar)((tmp >= 25) ? 25 : (tmp <= 3) ? 3 : tmp);
}